

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

extent_t * base_alloc_extent(tsdn_t *tsdn,base_t *base)

{
  extent_t *extent_00;
  extent_t *extent;
  size_t esn;
  undefined8 local_20;
  size_t *in_stack_fffffffffffffff8;
  
  extent_00 = (extent_t *)base_alloc_impl(tsdn,base,esn,(size_t)extent,in_stack_fffffffffffffff8);
  if (extent_00 == (extent_t *)0x0) {
    extent_00 = (extent_t *)0x0;
  }
  else {
    extent_esn_set(extent_00,local_20);
  }
  return extent_00;
}

Assistant:

extent_t *
base_alloc_extent(tsdn_t *tsdn, base_t *base) {
	size_t esn;
	extent_t *extent = base_alloc_impl(tsdn, base, sizeof(extent_t),
	    CACHELINE, &esn);
	if (extent == NULL) {
		return NULL;
	}
	extent_esn_set(extent, esn);
	return extent;
}